

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase145::run(TestCase145 *this)

{
  __pid_t __pid;
  char *in_R8;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *in_R9;
  char *params_2;
  siginfo_t *params_3;
  siginfo_t *this_00;
  anon_enum_32 local_26c;
  DebugComparison<int,_int_&> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  
  if ((anonymous_namespace)::BROKEN_QEMU == '\0') {
    captureSignals();
    UnixEventPort::UnixEventPort(&port);
    EventLoop::EventLoop(&loop,&port.super_EventPort);
    waitScope.busyPollInterval = 0xffffffff;
    waitScope.fiber.ptr = (FiberBase *)0x0;
    waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
    waitScope.loop = &loop;
    EventLoop::enterScope(&loop);
    __pid = getpid();
    kill(__pid,0x17);
    UnixEventPort::onSignal((UnixEventPort *)&_kjCondition,(int)&port);
    params_2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    params_3 = (siginfo_t *)0x3d740e;
    this_00 = &info;
    Promise<siginfo_t>::wait((Promise<siginfo_t> *)this_00,&_kjCondition);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    _kjCondition.result = info.si_signo == 0x17;
    _kjCondition.left = 0x17;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
      params_2 = (char *)&local_26c;
      local_26c = _SC_AIO_LISTIO_MAX;
      in_R8 = "failed: expected (23) == (info.si_signo)";
      in_R9 = (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *)&_kjCondition;
      _kjCondition.right = &this_00->si_signo;
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x9c,ERROR,
                 "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                 ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                 (DebugComparison<int,_int_&> *)in_R9,(int *)params_2,&this_00->si_signo);
      params_3 = this_00;
    }
    _kjCondition.right = &info.si_code;
    _kjCondition.left = 0;
    _kjCondition.result = info.si_code == 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_26c = DT_UNKNOWN;
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<__11,int&>&,__11,int&>
                ((char *)0x9d,(int)&_kjCondition,(LogSeverity)&local_26c,(char *)_kjCondition.right,
                 (char (*) [45])in_R8,in_R9,(anon_enum_32 *)params_2,&params_3->si_signo);
    }
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}